

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O0

bool test_remove_gap4b(Data *data,int offset)

{
  int iVar1;
  uchar *puVar2;
  LogHelper *pLVar3;
  long lVar4;
  uint8_t local_41;
  int local_40;
  int iStack_3c;
  uint8_t fill;
  int len;
  int splice;
  TrackDataParser parser;
  int offset_local;
  Data *data_local;
  
  parser._20_4_ = offset;
  iVar1 = Data::size(data);
  if (iVar1 < (int)parser._20_4_) {
    data_local._7_1_ = false;
  }
  else {
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       (&data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
    lVar4 = (long)(int)parser._20_4_;
    iVar1 = Data::size(data);
    TrackDataParser::TrackDataParser((TrackDataParser *)&len,puVar2 + lVar4,iVar1 - parser._20_4_);
    iStack_3c = 0;
    local_40 = 0;
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [16])"----gap4b----:\n");
    }
    TrackDataParser::GetGapRun((TrackDataParser *)&len,&local_40,&local_41,(bool *)0x0);
    if (local_40 == 0) {
      iStack_3c = 1;
      while (iVar1 = TrackDataParser::GetGapRun
                               ((TrackDataParser *)&len,&local_40,&local_41,(bool *)0x0),
            iVar1 != 0 && local_40 == 0) {
        iStack_3c = iStack_3c + 1;
      }
      if (opt.debug != 0) {
        pLVar3 = util::operator<<((LogHelper *)&util::cout,(char (*) [7])"found ");
        pLVar3 = util::operator<<(pLVar3,&stack0xffffffffffffffc4);
        util::operator<<(pLVar3,(char (*) [14])0x2a849a);
      }
    }
    if ((local_40 < 1) || ((local_41 != 'N' && (local_41 != '\0')))) {
      if (0 < local_40) {
        if (opt.debug != 0) {
          pLVar3 = util::operator<<((LogHelper *)&util::cout,(char (*) [17])"stopping due to ");
          pLVar3 = util::operator<<(pLVar3,&local_40);
          pLVar3 = util::operator<<(pLVar3,(char (*) [11])" bytes of ");
          pLVar3 = util::operator<<(pLVar3,&local_41);
          util::operator<<(pLVar3,(char (*) [9])" filler\n");
        }
        return false;
      }
    }
    else if (opt.debug != 0) {
      pLVar3 = util::operator<<((LogHelper *)&util::cout,(char (*) [7])"found ");
      pLVar3 = util::operator<<(pLVar3,&local_40);
      pLVar3 = util::operator<<(pLVar3,(char (*) [11])" bytes of ");
      pLVar3 = util::operator<<(pLVar3,&local_41);
      util::operator<<(pLVar3,(char (*) [9])" filler\n");
    }
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [22])"gap4b can be removed\n");
    }
    data_local._7_1_ = true;
  }
  return data_local._7_1_;
}

Assistant:

bool test_remove_gap4b(const Data& data, int offset)
{
    if (data.size() < offset)
        return false;

    TrackDataParser parser(data.data() + offset, data.size() - offset);
    auto splice = 0, len = 0;
    uint8_t fill;

    if (opt.debug) util::cout << "----gap4b----:\n";

    parser.GetGapRun(len, fill);

    if (!len)
    {
        splice = 1;
        for (; parser.GetGapRun(len, fill) && !len; ++splice);
        if (opt.debug) util::cout << "found " << splice << " splice bits\n";
        /*
        auto max_splice = (opt.maxsplice == -1) ? DEFAULT_MAX_SPLICE : opt.maxsplice;
        if (splice > max_splice)
        {
        if (opt.debug) util::cout << "stopping due to too many splice bits\n";
        return false;
        }
        */
    }

    if (len > 0 && (fill == 0x4e || fill == 0x00))
    {
        if (opt.debug) util::cout << "found " << len << " bytes of " << fill << " filler\n";
    }
    else if (len > 0)
    {
        if (opt.debug) util::cout << "stopping due to " << len << " bytes of " << fill << " filler\n";
        return false;
    }

    if (opt.debug) util::cout << "gap4b can be removed\n";
    return true;
}